

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::ruby::DefaultValueForField_abi_cxx11_
          (string *__return_storage_ptr__,ruby *this,FieldDescriptor *field)

{
  ruby rVar1;
  EnumValueDescriptor *pEVar2;
  ostream *poVar3;
  undefined8 uVar4;
  char *pcVar5;
  int iVar6;
  char *pcVar7;
  long lVar8;
  ulong uVar9;
  string default_str;
  ostringstream os;
  ruby *local_1d8;
  ulong local_1d0;
  FieldDescriptor local_1c8 [16];
  ruby *local_1b8;
  _func_void_FieldDescriptor_ptr *local_1b0;
  _func_void_FieldDescriptor_ptr *local_1a8 [2];
  undefined8 uStack_198;
  uint auStack_190 [22];
  ios_base local_138 [112];
  char acStack_c8 [152];
  
  if (*(once_flag **)(this + 0x30) != (once_flag *)0x0) {
    local_1a8[0] = FieldDescriptor::TypeOnceInit;
    local_1d8 = this;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(this + 0x30),local_1a8,(FieldDescriptor **)&local_1d8);
  }
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(this + 0x38) * 4)) {
  case 1:
    iVar6 = *(int *)(this + 0x90);
    goto LAB_0027f2dc;
  case 2:
    NumberToString<long>(__return_storage_ptr__,*(long *)(this + 0x90));
    break;
  case 3:
    NumberToString<unsigned_int>(__return_storage_ptr__,*(uint *)(this + 0x90));
    break;
  case 4:
    NumberToString<unsigned_long>(__return_storage_ptr__,*(unsigned_long *)(this + 0x90));
    break;
  case 5:
    NumberToString<double>(__return_storage_ptr__,*(double *)(this + 0x90));
    break;
  case 6:
    NumberToString<float>(__return_storage_ptr__,*(float *)(this + 0x90));
    break;
  case 7:
    rVar1 = this[0x90];
    pcVar7 = "false";
    if ((ulong)(byte)rVar1 != 0) {
      pcVar7 = "true";
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = pcVar7 + ((ulong)(byte)rVar1 ^ 5);
    goto LAB_0027f3ee;
  case 8:
    pEVar2 = FieldDescriptor::default_value_enum((FieldDescriptor *)this);
    iVar6 = *(int *)(pEVar2 + 0x10);
LAB_0027f2dc:
    NumberToString<int>(__return_storage_ptr__,iVar6);
    break;
  case 9:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    local_1d8 = (ruby *)local_1c8;
    lVar8 = **(long **)(this + 0x90);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1d8,lVar8,(*(long **)(this + 0x90))[1] + lVar8);
    if (*(once_flag **)(this + 0x30) != (once_flag *)0x0) {
      local_1b0 = FieldDescriptor::TypeOnceInit;
      local_1b8 = this;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(this + 0x30),&local_1b0,(FieldDescriptor **)&local_1b8);
    }
    iVar6 = *(int *)(this + 0x38);
    if (iVar6 == 9) {
      pcVar5 = "\"";
      lVar8 = 1;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\"",1);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(char *)local_1d8,local_1d0);
LAB_0027f4f8:
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar5,lVar8);
    }
    else {
      if (*(once_flag **)(this + 0x30) != (once_flag *)0x0) {
        local_1b0 = FieldDescriptor::TypeOnceInit;
        local_1b8 = this;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(this + 0x30),&local_1b0,(FieldDescriptor **)&local_1b8);
        iVar6 = *(int *)(this + 0x38);
      }
      if (iVar6 == 0xc) {
        poVar3 = (ostream *)local_1a8;
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"",1);
        lVar8 = *(long *)(local_1a8[0] + -0x18);
        if (acStack_c8[lVar8 + 1] == '\0') {
          std::ios::widen((char)&local_1d8 + (char)lVar8 + '0');
          acStack_c8[lVar8 + 1] = '\x01';
        }
        acStack_c8[lVar8] = '0';
        lVar8 = 0x1e;
        pcVar5 = "\".force_encoding(\"ASCII-8BIT\")";
        if (local_1d0 != 0) {
          uVar9 = 0;
          poVar3 = (ostream *)local_1a8;
          do {
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\\x",2);
            *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
                 *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
            *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 2;
            if (local_1d0 <= uVar9) {
              uVar4 = std::__throw_out_of_range_fmt
                                ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)"
                                 ,uVar9);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              std::ios_base::~ios_base(local_138);
              _Unwind_Resume(uVar4);
            }
            std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
            uVar9 = uVar9 + 1;
          } while (uVar9 < local_1d0);
        }
        goto LAB_0027f4f8;
      }
    }
    std::__cxx11::stringbuf::str();
    if (local_1d8 != (ruby *)local_1c8) {
      operator_delete(local_1d8);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    break;
  default:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = "";
    pcVar7 = "";
LAB_0027f3ee:
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar7,pcVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DefaultValueForField(const FieldDescriptor* field) {
  switch(field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT32:
      return NumberToString(field->default_value_int32());
    case FieldDescriptor::CPPTYPE_INT64:
      return NumberToString(field->default_value_int64());
    case FieldDescriptor::CPPTYPE_UINT32:
      return NumberToString(field->default_value_uint32());
    case FieldDescriptor::CPPTYPE_UINT64:
      return NumberToString(field->default_value_uint64());
    case FieldDescriptor::CPPTYPE_FLOAT:
      return NumberToString(field->default_value_float());
    case FieldDescriptor::CPPTYPE_DOUBLE:
      return NumberToString(field->default_value_double());
    case FieldDescriptor::CPPTYPE_BOOL:
      return field->default_value_bool() ? "true" : "false";
    case FieldDescriptor::CPPTYPE_ENUM:
      return NumberToString(field->default_value_enum()->number());
    case FieldDescriptor::CPPTYPE_STRING: {
      std::ostringstream os;
      string default_str = field->default_value_string();

      if (field->type() == FieldDescriptor::TYPE_STRING) {
        os << "\"" << default_str << "\"";
      } else if (field->type() == FieldDescriptor::TYPE_BYTES) {
        os << "\"";

        os.fill('0');
        for (int i = 0; i < default_str.length(); ++i) {
          // Write the hex form of each byte.
          os << "\\x" << std::hex << std::setw(2)
             << ((uint16)((unsigned char)default_str.at(i)));
        }
        os << "\".force_encoding(\"ASCII-8BIT\")";
      }

      return os.str();
    }
    default: assert(false); return "";
  }
}